

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pushdown_aggregate.cpp
# Opt level: O2

void __thiscall
duckdb::FilterPushdown::ExtractFilterBindings
          (FilterPushdown *this,Expression *expr,vector<duckdb::ColumnBinding,_true> *bindings)

{
  BoundColumnRefExpression *pBVar1;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  if ((expr->super_BaseExpression).type == BOUND_COLUMN_REF) {
    pBVar1 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&expr->super_BaseExpression);
    ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::push_back
              (&bindings->
                super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>,
               &pBVar1->binding);
  }
  local_20 = ::std::
             _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/pushdown/pushdown_aggregate.cpp:31:46)>
             ::_M_invoke;
  local_28 = ::std::
             _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/pushdown/pushdown_aggregate.cpp:31:46)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  local_38._8_8_ = bindings;
  ExpressionIterator::EnumerateChildren(expr,(function<void_(duckdb::Expression_&)> *)&local_38);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return;
}

Assistant:

void FilterPushdown::ExtractFilterBindings(Expression &expr, vector<ColumnBinding> &bindings) {
	if (expr.GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
		auto &colref = expr.Cast<BoundColumnRefExpression>();
		bindings.push_back(colref.binding);
	}
	ExpressionIterator::EnumerateChildren(expr, [&](Expression &child) { ExtractFilterBindings(child, bindings); });
}